

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.h
# Opt level: O2

type __thiscall
llvm::yaml::
yamlize<std::vector<llvm::yaml::Hex64,std::allocator<llvm::yaml::Hex64>>,llvm::yaml::EmptyContext>
          (yaml *this,IO *io,vector<llvm::yaml::Hex64,_std::allocator<llvm::yaml::Hex64>_> *Seq,
          bool param_3,EmptyContext *Ctx)

{
  char cVar1;
  uint uVar2;
  type *Val;
  undefined7 in_register_00000009;
  uint i;
  ulong index;
  ulong uVar3;
  undefined8 local_40;
  void *SaveInfo;
  
  SaveInfo = (void *)CONCAT71(in_register_00000009,param_3);
  uVar2 = (**(code **)(*(long *)this + 0x40))();
  cVar1 = (**(code **)(*(long *)this + 0x10))(this);
  uVar3 = (ulong)((long)io->Ctxt - (long)io->_vptr_IO) >> 3 & 0xffffffff;
  if (cVar1 == '\0') {
    uVar3 = (ulong)uVar2;
  }
  for (index = 0; uVar3 != index; index = index + 1) {
    cVar1 = (**(code **)(*(long *)this + 0x48))(this,index & 0xffffffff,&local_40);
    if (cVar1 != '\0') {
      Val = SequenceTraitsImpl<std::vector<llvm::yaml::Hex64,_std::allocator<llvm::yaml::Hex64>_>,_true>
            ::element((IO *)this,(vector<llvm::yaml::Hex64,_std::allocator<llvm::yaml::Hex64>_> *)io
                      ,index);
      yamlize<llvm::yaml::Hex64>((IO *)this,Val,true,(EmptyContext *)SaveInfo);
      (**(code **)(*(long *)this + 0x50))(this,local_40);
    }
  }
  (**(code **)(*(long *)this + 0x58))(this);
  return;
}

Assistant:

typename std::enable_if<has_SequenceTraits<T>::value, void>::type
yamlize(IO &io, T &Seq, bool, Context &Ctx) {
  if ( has_FlowTraits< SequenceTraits<T>>::value ) {
    unsigned incnt = io.beginFlowSequence();
    unsigned count = io.outputting() ? SequenceTraits<T>::size(io, Seq) : incnt;
    for(unsigned i=0; i < count; ++i) {
      void *SaveInfo;
      if ( io.preflightFlowElement(i, SaveInfo) ) {
        yamlize(io, SequenceTraits<T>::element(io, Seq, i), true, Ctx);
        io.postflightFlowElement(SaveInfo);
      }
    }
    io.endFlowSequence();
  }
  else {
    unsigned incnt = io.beginSequence();
    unsigned count = io.outputting() ? SequenceTraits<T>::size(io, Seq) : incnt;
    for(unsigned i=0; i < count; ++i) {
      void *SaveInfo;
      if ( io.preflightElement(i, SaveInfo) ) {
        yamlize(io, SequenceTraits<T>::element(io, Seq, i), true, Ctx);
        io.postflightElement(SaveInfo);
      }
    }
    io.endSequence();
  }
}